

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_archive.cpp
# Opt level: O0

bool Internal_IgnoreSavedLimitPointList(ON_BinaryArchive *archive,uint vertex_face_count)

{
  bool bVar1;
  ON__UINT_PTR local_a0;
  ON_SubDFacePtr fptr;
  ON_SubDSectorSurfacePoint limit_point;
  uint i;
  uint limit_point_count;
  uchar c;
  ON_BinaryArchive *pOStack_18;
  uint vertex_face_count_local;
  ON_BinaryArchive *archive_local;
  
  i._3_1_ = '\0';
  limit_point_count = vertex_face_count;
  pOStack_18 = archive;
  bVar1 = ON_BinaryArchive::ReadChar(archive,(ON__UINT8 *)((long)&i + 3));
  if (bVar1) {
    if (i._3_1_ == '\0') {
      return true;
    }
    limit_point.m_sector_face._4_4_ = 0;
    bVar1 = ON_BinaryArchive::ReadInt
                      (pOStack_18,(ON__UINT32 *)((long)&limit_point.m_sector_face + 4));
    if (((bVar1) && (limit_point.m_sector_face._4_4_ != 0)) &&
       (limit_point.m_sector_face._4_4_ <= limit_point_count)) {
      for (limit_point.m_sector_face._0_4_ = 0;
          (uint)limit_point.m_sector_face < limit_point.m_sector_face._4_4_;
          limit_point.m_sector_face._0_4_ = (uint)limit_point.m_sector_face + 1) {
        memcpy(&fptr,&ON_SubDSectorSurfacePoint::Unset,0x70);
        bVar1 = Internal_ReadDouble3(pOStack_18,(double *)&fptr);
        if (((!bVar1) || (bVar1 = Internal_ReadDouble3(pOStack_18,limit_point.m_limitP + 2), !bVar1)
            ) || ((bVar1 = Internal_ReadDouble3(pOStack_18,limit_point.m_limitT1 + 2), !bVar1 ||
                  (bVar1 = Internal_ReadDouble3(pOStack_18,limit_point.m_limitT2 + 2), !bVar1))))
        break;
        local_a0 = 0;
        bVar1 = Internal_ReadArchiveIdAndFlagsIntoComponentPtr(pOStack_18,&local_a0);
        if (!bVar1) break;
      }
      if (limit_point.m_sector_face._4_4_ == (uint)limit_point.m_sector_face) {
        return true;
      }
    }
  }
  ON_SubDIncrementErrorCount();
  return false;
}

Assistant:

static bool Internal_IgnoreSavedLimitPointList(
  ON_BinaryArchive& archive,
  unsigned int vertex_face_count
  //ON_SimpleArray< ON_SubDSectorSurfacePoint > limit_points // NOTE MISSING & means this array was by value and not by reference
  )
{
  //limit_points.SetCount(0);

  for (;;)
  {
    unsigned char c = 0;
    if (!archive.ReadChar(&c))
      break;

    if ( 0 == c)
      return true;

    unsigned int limit_point_count = 0;
    if (!archive.ReadInt(&limit_point_count))
      break;

    if ( 0 == limit_point_count )
      break;

    if (limit_point_count > vertex_face_count)
      break;

    //limit_points.Reserve(limit_point_count);
    unsigned int i = 0;
    for ( /*empty init*/; i < limit_point_count; i++)
    {
      ON_SubDSectorSurfacePoint limit_point = ON_SubDSectorSurfacePoint::Unset;
      if (!Internal_ReadDouble3(archive,limit_point.m_limitP))
        break;
      if (!Internal_ReadDouble3(archive,limit_point.m_limitT1))
        break;
      if (!Internal_ReadDouble3(archive,limit_point.m_limitT2))
        break;
      if (!Internal_ReadDouble3(archive,limit_point.m_limitN))
        break;
      ON_SubDFacePtr fptr = ON_SubDFacePtr::Null;
      if (!Internal_ReadArchiveIdAndFlagsIntoComponentPtr(archive,fptr.m_ptr))
        break;
      //limit_points.Append(limit_point);
    }

    if (limit_point_count != i )
      break;

    //if (4 != c)
    //  limit_points.SetCount(0);

    return true;
  }
  return ON_SUBD_RETURN_ERROR(false);
}